

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  _Base_ptr p_Var1;
  
  if ((this->i).has_value == true) {
    roaring_uint32_iterator_advance((roaring_uint32_iterator_t *)&this->i);
  }
  while( true ) {
    if ((this->i).has_value != false) {
      return this;
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              (&this->map_iter);
    p_Var1 = (this->map_iter)._M_node;
    if ((_Rb_tree_header *)p_Var1 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) break;
    roaring_iterator_init
              ((roaring_bitmap_t *)&p_Var1[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
  }
  return this;
}

Assistant:

type_of_iterator &operator++() {  // ++i, must returned inc. value
        if (i.has_value == true) roaring_uint32_iterator_advance(&i);
        while (!i.has_value) {
            ++map_iter;
            if (map_iter == p->cend()) return *this;
            roaring_iterator_init(&map_iter->second.roaring, &i);
        }
        return *this;
    }